

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::ECConsume
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,CharCount n)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  uint local_18;
  CharCount i;
  CharCount n_local;
  Parser<UTF8EncodingPolicyBase<false>,_false> *this_local;
  
  if (this->inputLim < this->next + n) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_18 = 0;
  do {
    if (n <= local_18) {
      this->next = this->next + n;
      return;
    }
    BVar3 = UTF8EncodingPolicyBase<false>::IsMultiUnitChar((ushort)this->next[local_18]);
    if (BVar3 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd6,"(!this->IsMultiUnitChar(next[i]))","!this->IsMultiUnitChar(next[i])"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

inline void Parser<P, IsLiteral>::ECConsume(CharCount n /*= 1*/)
    {
        Assert(next + n <= inputLim);
#if DBG
        for (CharCount i = 0; i < n; i++)
            Assert(!this->IsMultiUnitChar(next[i]));
#endif
        next += n;
    }